

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O1

void aom_lpf_horizontal_8_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  ushort uVar55;
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  byte bVar64;
  undefined1 auVar65 [15];
  unkuint9 Var66;
  undefined1 auVar67 [11];
  undefined1 auVar68 [15];
  unkuint9 Var69;
  undefined1 auVar70 [11];
  undefined1 auVar71 [15];
  unkuint9 Var72;
  undefined1 auVar73 [11];
  undefined1 auVar74 [15];
  unkuint9 Var75;
  undefined1 auVar76 [11];
  undefined1 auVar77 [15];
  unkuint9 Var78;
  undefined1 auVar79 [11];
  undefined1 auVar80 [15];
  unkuint9 Var81;
  undefined1 auVar82 [11];
  undefined1 auVar83 [15];
  unkuint9 Var84;
  undefined1 auVar85 [11];
  undefined1 auVar86 [15];
  undefined1 auVar87 [11];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  long lVar104;
  undefined1 auVar105 [16];
  ushort uVar106;
  ushort uVar108;
  ushort uVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  ushort uVar114;
  undefined1 auVar107 [16];
  byte bVar115;
  byte bVar120;
  short sVar117;
  byte bVar136;
  short sVar134;
  ulong uVar118;
  byte bVar122;
  byte bVar125;
  short sVar124;
  byte bVar127;
  byte bVar130;
  short sVar129;
  byte bVar132;
  short sVar138;
  short sVar139;
  short sVar140;
  undefined1 auVar119 [16];
  short sVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  ushort uVar152;
  ushort uVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar163 [16];
  byte bVar164;
  ushort uVar165;
  ulong uVar166;
  byte bVar170;
  byte bVar172;
  ushort uVar174;
  byte bVar175;
  byte bVar177;
  ushort uVar179;
  byte bVar180;
  byte bVar182;
  byte bVar185;
  byte bVar187;
  ushort uVar188;
  byte bVar189;
  byte bVar190;
  ushort uVar191;
  byte bVar192;
  byte bVar193;
  ushort uVar194;
  byte bVar195;
  byte bVar196;
  byte bVar198;
  undefined1 auVar167 [16];
  char cVar171;
  char cVar173;
  char cVar176;
  char cVar178;
  char cVar181;
  char cVar183;
  char cVar186;
  undefined1 auVar168 [16];
  ushort uVar184;
  ushort uVar197;
  undefined1 auVar169 [16];
  ushort uVar199;
  short sVar201;
  short sVar202;
  short sVar203;
  short sVar204;
  short sVar205;
  short sVar206;
  undefined1 auVar200 [16];
  byte bVar207;
  byte bVar211;
  byte bVar212;
  byte bVar213;
  byte bVar214;
  byte bVar215;
  byte bVar216;
  byte bVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined4 uVar218;
  undefined1 auVar220 [16];
  byte bVar221;
  byte bVar222;
  byte bVar226;
  byte bVar227;
  short sVar223;
  short sVar224;
  short sVar225;
  byte bVar228;
  byte bVar229;
  byte bVar233;
  byte bVar234;
  short sVar230;
  short sVar231;
  short sVar232;
  byte bVar235;
  byte bVar236;
  byte bVar240;
  byte bVar241;
  short sVar237;
  short sVar238;
  short sVar239;
  byte bVar242;
  byte bVar243;
  byte bVar247;
  byte bVar248;
  short sVar244;
  short sVar245;
  short sVar246;
  byte bVar249;
  byte bVar253;
  short sVar250;
  short sVar251;
  short sVar252;
  byte bVar254;
  byte bVar258;
  short sVar255;
  short sVar256;
  short sVar257;
  byte bVar259;
  byte bVar263;
  short sVar260;
  short sVar261;
  short sVar262;
  byte bVar264;
  byte bVar267;
  short sVar265;
  short sVar266;
  undefined1 auVar268 [16];
  ushort uVar269;
  ushort uVar271;
  ushort uVar272;
  undefined1 auVar270 [16];
  ushort uVar273;
  ushort uVar274;
  ushort uVar277;
  ushort uVar278;
  short sVar279;
  ushort uVar281;
  ushort uVar282;
  ushort uVar283;
  undefined1 auVar275 [16];
  ushort uVar280;
  ushort uVar284;
  undefined1 auVar276 [16];
  ushort uVar285;
  short sVar288;
  short sVar289;
  short sVar290;
  short sVar291;
  short sVar292;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  byte bVar116;
  byte bVar121;
  byte bVar123;
  byte bVar126;
  byte bVar128;
  byte bVar131;
  byte bVar133;
  short sVar135;
  byte bVar137;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined8 uVar219;
  
  bVar253 = *_blimit0;
  bVar254 = _blimit0[1];
  bVar258 = _blimit0[2];
  bVar259 = _blimit0[3];
  bVar263 = _blimit0[4];
  bVar264 = _blimit0[5];
  bVar267 = _blimit0[6];
  bVar222 = _blimit0[7];
  bVar227 = *_blimit1;
  bVar229 = _blimit1[1];
  bVar234 = _blimit1[2];
  bVar236 = _blimit1[3];
  bVar241 = _blimit1[4];
  bVar243 = _blimit1[5];
  bVar248 = _blimit1[6];
  bVar64 = _blimit1[7];
  bVar221 = *_thresh0;
  bVar226 = _thresh0[1];
  bVar228 = _thresh0[2];
  bVar233 = _thresh0[3];
  bVar235 = *_thresh1;
  bVar240 = _thresh1[1];
  bVar242 = _thresh1[2];
  bVar247 = _thresh1[3];
  lVar104 = (long)p;
  uVar166 = *(ulong *)(s + lVar104 * -3);
  uVar1 = *(ulong *)(s + lVar104 * -2);
  uVar2 = *(ulong *)(s + -lVar104);
  uVar6 = *(ulong *)s;
  uVar118 = *(ulong *)(s + lVar104 * 2);
  uVar3 = *(ulong *)(s + lVar104);
  auVar286._8_8_ = uVar3;
  auVar286._0_8_ = uVar1;
  auVar208._8_8_ = uVar6;
  auVar208._0_8_ = uVar2;
  auVar270._8_8_ = uVar1;
  auVar270._0_8_ = uVar2;
  auVar200._8_4_ = (int)uVar3;
  auVar200._0_8_ = uVar6;
  auVar200._12_4_ = (int)(uVar3 >> 0x20);
  auVar119 = psubusb(auVar286,auVar208);
  auVar268 = psubusb(auVar208,auVar286);
  auVar268 = auVar268 | auVar119;
  auVar119 = psubusb(auVar270,auVar200);
  auVar144 = psubusb(auVar200,auVar270);
  auVar144 = auVar144 | auVar119;
  bVar207 = auVar268[0];
  bVar116 = auVar268[8];
  bVar115 = (bVar116 < bVar207) * bVar207 | (bVar116 >= bVar207) * bVar116;
  bVar211 = auVar268[1];
  bVar121 = auVar268[9];
  bVar120 = (bVar121 < bVar211) * bVar211 | (bVar121 >= bVar211) * bVar121;
  bVar212 = auVar268[2];
  bVar123 = auVar268[10];
  bVar122 = (bVar123 < bVar212) * bVar212 | (bVar123 >= bVar212) * bVar123;
  bVar213 = auVar268[3];
  bVar126 = auVar268[0xb];
  bVar125 = (bVar126 < bVar213) * bVar213 | (bVar126 >= bVar213) * bVar126;
  bVar214 = auVar268[4];
  bVar128 = auVar268[0xc];
  bVar127 = (bVar128 < bVar214) * bVar214 | (bVar128 >= bVar214) * bVar128;
  bVar215 = auVar268[5];
  bVar131 = auVar268[0xd];
  bVar130 = (bVar131 < bVar215) * bVar215 | (bVar131 >= bVar215) * bVar131;
  bVar216 = auVar268[6];
  bVar133 = auVar268[0xe];
  bVar132 = (bVar133 < bVar216) * bVar216 | (bVar133 >= bVar216) * bVar133;
  bVar217 = auVar268[7];
  bVar137 = auVar268[0xf];
  bVar136 = (bVar137 < bVar217) * bVar217 | (bVar137 >= bVar217) * bVar137;
  uVar218 = CONCAT13(-((byte)((bVar125 < bVar233) * bVar125 | (bVar125 >= bVar233) * bVar233) ==
                      bVar125),
                     CONCAT12(-((byte)((bVar122 < bVar228) * bVar122 |
                                      (bVar122 >= bVar228) * bVar228) == bVar122),
                              CONCAT11(-((byte)((bVar120 < bVar226) * bVar120 |
                                               (bVar120 >= bVar226) * bVar226) == bVar120),
                                       -((byte)((bVar115 < bVar221) * bVar115 |
                                               (bVar115 >= bVar221) * bVar221) == bVar115))));
  uVar219 = CONCAT17(-((byte)((bVar136 < bVar247) * bVar136 | (bVar136 >= bVar247) * bVar247) ==
                      bVar136),
                     CONCAT16(-((byte)((bVar132 < bVar242) * bVar132 |
                                      (bVar132 >= bVar242) * bVar242) == bVar132),
                              CONCAT15(-((byte)((bVar130 < bVar240) * bVar130 |
                                               (bVar130 >= bVar240) * bVar240) == bVar130),
                                       CONCAT14(-((byte)((bVar127 < bVar235) * bVar127 |
                                                        (bVar127 >= bVar235) * bVar235) == bVar127),
                                                uVar218))));
  auVar119 = paddusb(auVar144,auVar144);
  auVar287._0_2_ = auVar144._8_2_ >> 1;
  auVar287._2_2_ = auVar144._10_2_ >> 1;
  auVar287._4_2_ = auVar144._12_2_ >> 1;
  auVar287._6_2_ = auVar144._14_2_ >> 1;
  auVar287._8_8_ = 0;
  auVar209._0_8_ = auVar119._0_8_;
  auVar209._8_4_ = auVar119._0_4_;
  auVar209._12_4_ = auVar119._4_4_;
  auVar119 = paddusb(auVar287 & _DAT_004d1610,auVar209);
  auVar105._8_8_ = uVar118;
  auVar105._0_8_ = uVar166;
  bVar226 = auVar119[0];
  bVar228 = auVar119[1];
  bVar233 = auVar119[2];
  bVar235 = auVar119[3];
  bVar240 = auVar119[4];
  bVar242 = auVar119[5];
  bVar247 = auVar119[6];
  bVar115 = auVar119[7];
  bVar120 = auVar119[8];
  bVar122 = auVar119[9];
  bVar125 = auVar119[10];
  bVar127 = auVar119[0xb];
  bVar130 = auVar119[0xc];
  bVar132 = auVar119[0xd];
  bVar136 = auVar119[0xe];
  bVar249 = auVar119[0xf];
  auVar119 = psubusb(auVar105,auVar286);
  auVar287 = psubusb(auVar286,auVar105);
  auVar287 = auVar287 | auVar119;
  uVar4 = *(ulong *)(s + lVar104 * 3);
  auVar119._8_8_ = uVar4;
  auVar119._0_8_ = *(undefined8 *)(s + -(long)(p * 4));
  auVar144 = psubusb(auVar105,auVar119);
  auVar268 = psubusb(auVar105,auVar208);
  auVar275 = psubusb(auVar119,auVar208);
  auVar209 = psubusb(auVar208,auVar119);
  auVar119 = psubusb(auVar119,auVar105);
  auVar144 = auVar144 | auVar119;
  bVar221 = auVar287[0];
  bVar164 = auVar144[0];
  bVar164 = (bVar164 < bVar221) * bVar221 | (bVar164 >= bVar221) * bVar164;
  bVar221 = auVar287[1];
  bVar170 = auVar144[1];
  bVar170 = (bVar170 < bVar221) * bVar221 | (bVar170 >= bVar221) * bVar170;
  bVar221 = auVar287[2];
  bVar172 = auVar144[2];
  bVar172 = (bVar172 < bVar221) * bVar221 | (bVar172 >= bVar221) * bVar172;
  bVar221 = auVar287[3];
  bVar175 = auVar144[3];
  bVar175 = (bVar175 < bVar221) * bVar221 | (bVar175 >= bVar221) * bVar175;
  bVar221 = auVar287[4];
  bVar177 = auVar144[4];
  bVar177 = (bVar177 < bVar221) * bVar221 | (bVar177 >= bVar221) * bVar177;
  bVar221 = auVar287[5];
  bVar180 = auVar144[5];
  bVar180 = (bVar180 < bVar221) * bVar221 | (bVar180 >= bVar221) * bVar180;
  bVar221 = auVar287[6];
  bVar182 = auVar144[6];
  bVar182 = (bVar182 < bVar221) * bVar221 | (bVar182 >= bVar221) * bVar182;
  bVar221 = auVar287[7];
  bVar185 = auVar144[7];
  bVar185 = (bVar185 < bVar221) * bVar221 | (bVar185 >= bVar221) * bVar185;
  bVar221 = auVar287[8];
  bVar187 = auVar144[8];
  bVar187 = (bVar187 < bVar221) * bVar221 | (bVar187 >= bVar221) * bVar187;
  bVar221 = auVar287[9];
  bVar189 = auVar144[9];
  bVar189 = (bVar189 < bVar221) * bVar221 | (bVar189 >= bVar221) * bVar189;
  bVar221 = auVar287[10];
  bVar190 = auVar144[10];
  bVar190 = (bVar190 < bVar221) * bVar221 | (bVar190 >= bVar221) * bVar190;
  bVar221 = auVar287[0xb];
  bVar192 = auVar144[0xb];
  bVar192 = (bVar192 < bVar221) * bVar221 | (bVar192 >= bVar221) * bVar192;
  bVar221 = auVar287[0xc];
  bVar193 = auVar144[0xc];
  bVar193 = (bVar193 < bVar221) * bVar221 | (bVar193 >= bVar221) * bVar193;
  bVar221 = auVar287[0xd];
  bVar195 = auVar144[0xd];
  bVar195 = (bVar195 < bVar221) * bVar221 | (bVar195 >= bVar221) * bVar195;
  bVar221 = auVar287[0xe];
  bVar196 = auVar144[0xe];
  bVar198 = auVar144[0xf];
  bVar196 = (bVar196 < bVar221) * bVar221 | (bVar196 >= bVar221) * bVar196;
  bVar221 = auVar287[0xf];
  bVar198 = (bVar198 < bVar221) * bVar221 | (bVar198 >= bVar221) * bVar198;
  bVar221 = -((byte)((bVar226 < bVar253) * bVar226 | (bVar226 >= bVar253) * bVar253) == bVar226) ^
            0xff;
  bVar226 = -((byte)((bVar228 < bVar254) * bVar228 | (bVar228 >= bVar254) * bVar254) == bVar228) ^
            0xff;
  bVar228 = -((byte)((bVar233 < bVar258) * bVar233 | (bVar233 >= bVar258) * bVar258) == bVar233) ^
            0xff;
  bVar233 = -((byte)((bVar235 < bVar259) * bVar235 | (bVar235 >= bVar259) * bVar259) == bVar235) ^
            0xff;
  bVar235 = -((byte)((bVar240 < bVar227) * bVar240 | (bVar240 >= bVar227) * bVar227) == bVar240) ^
            0xff;
  bVar240 = -((byte)((bVar242 < bVar229) * bVar242 | (bVar242 >= bVar229) * bVar229) == bVar242) ^
            0xff;
  bVar242 = -((byte)((bVar247 < bVar234) * bVar247 | (bVar247 >= bVar234) * bVar234) == bVar247) ^
            0xff;
  bVar247 = -((byte)((bVar115 < bVar236) * bVar115 | (bVar115 >= bVar236) * bVar236) == bVar115) ^
            0xff;
  bVar115 = -((byte)((bVar120 < bVar263) * bVar120 | (bVar120 >= bVar263) * bVar263) == bVar120) ^
            0xff;
  bVar120 = -((byte)((bVar122 < bVar264) * bVar122 | (bVar122 >= bVar264) * bVar264) == bVar122) ^
            0xff;
  bVar122 = -((byte)((bVar125 < bVar267) * bVar125 | (bVar125 >= bVar267) * bVar267) == bVar125) ^
            0xff;
  bVar125 = -((byte)((bVar127 < bVar222) * bVar127 | (bVar127 >= bVar222) * bVar222) == bVar127) ^
            0xff;
  bVar127 = -((byte)((bVar130 < bVar241) * bVar130 | (bVar130 >= bVar241) * bVar241) == bVar130) ^
            0xff;
  bVar130 = -((byte)((bVar132 < bVar243) * bVar132 | (bVar132 >= bVar243) * bVar243) == bVar132) ^
            0xff;
  bVar132 = -((byte)((bVar136 < bVar248) * bVar136 | (bVar136 >= bVar248) * bVar248) == bVar136) ^
            0xff;
  bVar136 = -((byte)((bVar249 < bVar64) * bVar249 | (bVar249 >= bVar64) * bVar64) == bVar249) ^ 0xff
  ;
  bVar221 = (bVar221 < bVar207) * bVar207 | (bVar221 >= bVar207) * bVar221;
  bVar226 = (bVar226 < bVar211) * bVar211 | (bVar226 >= bVar211) * bVar226;
  bVar228 = (bVar228 < bVar212) * bVar212 | (bVar228 >= bVar212) * bVar228;
  bVar233 = (bVar233 < bVar213) * bVar213 | (bVar233 >= bVar213) * bVar233;
  bVar235 = (bVar235 < bVar214) * bVar214 | (bVar235 >= bVar214) * bVar235;
  bVar240 = (bVar240 < bVar215) * bVar215 | (bVar240 >= bVar215) * bVar240;
  bVar242 = (bVar242 < bVar216) * bVar216 | (bVar242 >= bVar216) * bVar242;
  bVar247 = (bVar247 < bVar217) * bVar217 | (bVar247 >= bVar217) * bVar247;
  bVar249 = (bVar115 < bVar116) * bVar116 | (bVar115 >= bVar116) * bVar115;
  bVar253 = (bVar120 < bVar121) * bVar121 | (bVar120 >= bVar121) * bVar120;
  bVar254 = (bVar122 < bVar123) * bVar123 | (bVar122 >= bVar123) * bVar122;
  bVar258 = (bVar125 < bVar126) * bVar126 | (bVar125 >= bVar126) * bVar125;
  bVar259 = (bVar127 < bVar128) * bVar128 | (bVar127 >= bVar128) * bVar127;
  bVar263 = (bVar130 < bVar131) * bVar131 | (bVar130 >= bVar131) * bVar130;
  bVar264 = (bVar132 < bVar133) * bVar133 | (bVar132 >= bVar133) * bVar132;
  bVar267 = (bVar136 < bVar137) * bVar137 | (bVar136 >= bVar137) * bVar136;
  bVar115 = (bVar164 < bVar221) * bVar221 | (bVar164 >= bVar221) * bVar164;
  bVar120 = (bVar170 < bVar226) * bVar226 | (bVar170 >= bVar226) * bVar170;
  bVar122 = (bVar172 < bVar228) * bVar228 | (bVar172 >= bVar228) * bVar172;
  bVar125 = (bVar175 < bVar233) * bVar233 | (bVar175 >= bVar233) * bVar175;
  bVar127 = (bVar177 < bVar235) * bVar235 | (bVar177 >= bVar235) * bVar177;
  bVar130 = (bVar180 < bVar240) * bVar240 | (bVar180 >= bVar240) * bVar180;
  bVar132 = (bVar182 < bVar242) * bVar242 | (bVar182 >= bVar242) * bVar182;
  bVar136 = (bVar185 < bVar247) * bVar247 | (bVar185 >= bVar247) * bVar185;
  bVar226 = (bVar187 < bVar249) * bVar249 | (bVar187 >= bVar249) * bVar187;
  bVar221 = (bVar189 < bVar253) * bVar253 | (bVar189 >= bVar253) * bVar189;
  bVar247 = (bVar190 < bVar254) * bVar254 | (bVar190 >= bVar254) * bVar190;
  bVar240 = (bVar192 < bVar258) * bVar258 | (bVar192 >= bVar258) * bVar192;
  bVar242 = (bVar193 < bVar259) * bVar259 | (bVar193 >= bVar259) * bVar193;
  bVar235 = (bVar195 < bVar263) * bVar263 | (bVar195 >= bVar263) * bVar195;
  bVar233 = (bVar196 < bVar264) * bVar264 | (bVar196 >= bVar264) * bVar196;
  bVar228 = (bVar198 < bVar267) * bVar267 | (bVar198 >= bVar267) * bVar198;
  bVar222 = (bVar226 < bVar115) * bVar115 | (bVar226 >= bVar115) * bVar226;
  bVar227 = (bVar221 < bVar120) * bVar120 | (bVar221 >= bVar120) * bVar221;
  bVar229 = (bVar247 < bVar122) * bVar122 | (bVar247 >= bVar122) * bVar247;
  bVar234 = (bVar240 < bVar125) * bVar125 | (bVar240 >= bVar125) * bVar240;
  bVar236 = (bVar242 < bVar127) * bVar127 | (bVar242 >= bVar127) * bVar242;
  bVar241 = (bVar235 < bVar130) * bVar130 | (bVar235 >= bVar130) * bVar235;
  bVar243 = (bVar233 < bVar132) * bVar132 | (bVar233 >= bVar132) * bVar233;
  bVar248 = (bVar228 < bVar136) * bVar136 | (bVar228 >= bVar136) * bVar228;
  bVar226 = (bVar226 != 0) * bVar226;
  bVar221 = (bVar221 != 0) * bVar221;
  bVar247 = (bVar247 != 0) * bVar247;
  bVar240 = (bVar240 != 0) * bVar240;
  bVar242 = (bVar242 != 0) * bVar242;
  bVar235 = (bVar235 != 0) * bVar235;
  bVar233 = (bVar233 != 0) * bVar233;
  bVar228 = (bVar228 != 0) * bVar228;
  bVar115 = *_limit0;
  bVar120 = _limit0[1];
  bVar122 = _limit0[2];
  bVar125 = _limit0[3];
  bVar127 = _limit0[4];
  bVar130 = _limit0[5];
  bVar132 = _limit0[6];
  bVar136 = _limit0[7];
  bVar249 = *_limit1;
  bVar253 = _limit1[1];
  bVar254 = _limit1[2];
  bVar258 = _limit1[3];
  bVar259 = _limit1[4];
  bVar263 = _limit1[5];
  bVar264 = _limit1[6];
  bVar267 = _limit1[7];
  auVar144[0] = -((byte)((bVar222 < bVar115) * bVar222 | (bVar222 >= bVar115) * bVar115) == bVar222)
  ;
  auVar144[1] = -((byte)((bVar227 < bVar120) * bVar227 | (bVar227 >= bVar120) * bVar120) == bVar227)
  ;
  auVar144[2] = -((byte)((bVar229 < bVar122) * bVar229 | (bVar229 >= bVar122) * bVar122) == bVar229)
  ;
  auVar144[3] = -((byte)((bVar234 < bVar125) * bVar234 | (bVar234 >= bVar125) * bVar125) == bVar234)
  ;
  auVar144[4] = -((byte)((bVar236 < bVar249) * bVar236 | (bVar236 >= bVar249) * bVar249) == bVar236)
  ;
  auVar144[5] = -((byte)((bVar241 < bVar253) * bVar241 | (bVar241 >= bVar253) * bVar253) == bVar241)
  ;
  auVar144[6] = -((byte)((bVar243 < bVar254) * bVar243 | (bVar243 >= bVar254) * bVar254) == bVar243)
  ;
  auVar144[7] = -((byte)((bVar248 < bVar258) * bVar248 | (bVar248 >= bVar258) * bVar258) == bVar248)
  ;
  auVar144[8] = -((byte)((bVar226 < bVar127) * bVar226 | (bVar226 >= bVar127) * bVar127) == bVar226)
  ;
  auVar144[9] = -((byte)((bVar221 < bVar130) * bVar221 | (bVar221 >= bVar130) * bVar130) == bVar221)
  ;
  auVar144[10] = -((byte)((bVar247 < bVar132) * bVar247 | (bVar247 >= bVar132) * bVar132) == bVar247
                  );
  auVar144[0xb] =
       -((byte)((bVar240 < bVar136) * bVar240 | (bVar240 >= bVar136) * bVar136) == bVar240);
  auVar144[0xc] =
       -((byte)((bVar242 < bVar259) * bVar242 | (bVar242 >= bVar259) * bVar259) == bVar242);
  auVar144[0xd] =
       -((byte)((bVar235 < bVar263) * bVar235 | (bVar235 >= bVar263) * bVar263) == bVar235);
  auVar144[0xe] =
       -((byte)((bVar233 < bVar264) * bVar233 | (bVar233 >= bVar264) * bVar264) == bVar233);
  auVar144[0xf] =
       -((byte)((bVar228 < bVar267) * bVar228 | (bVar228 >= bVar267) * bVar267) == bVar228);
  auVar145._8_4_ = uVar218;
  auVar145._0_8_ = uVar219;
  auVar145._12_4_ = (int)((ulong)uVar219 >> 0x20);
  auVar287 = psubsb(auVar270 ^ _DAT_004d2980,auVar200 ^ _DAT_004d2980);
  auVar119 = psubsb(~auVar145 & auVar287 >> 0x40,auVar287);
  auVar119 = psubsb(auVar119,auVar287);
  auVar287 = psubsb(auVar119,auVar287);
  auVar287 = auVar287 & auVar144;
  auVar154._0_8_ = auVar287._0_8_;
  auVar154._8_4_ = auVar287._0_4_;
  auVar154._12_4_ = auVar287._4_4_;
  auVar119 = paddsb(auVar154,_DAT_005166d0);
  auVar167[1] = auVar119[8];
  auVar167[0] = auVar287[8];
  auVar167[2] = auVar287[9];
  auVar167[3] = auVar119[9];
  auVar167[4] = auVar287[10];
  auVar167[5] = auVar119[10];
  auVar167[6] = auVar287[0xb];
  auVar167[7] = auVar119[0xb];
  auVar167[8] = auVar287[0xc];
  auVar167[9] = auVar119[0xc];
  auVar167[10] = auVar287[0xd];
  auVar167[0xb] = auVar119[0xd];
  auVar167[0xc] = auVar287[0xe];
  auVar167[0xd] = auVar119[0xe];
  auVar167[0xe] = auVar287[0xf];
  auVar167[0xf] = auVar119[0xf];
  auVar162._0_14_ = auVar119._0_14_;
  auVar162[0xe] = auVar119[7];
  auVar162[0xf] = auVar119[7];
  auVar161._14_2_ = auVar162._14_2_;
  auVar161._0_13_ = auVar119._0_13_;
  auVar161[0xd] = auVar119[6];
  auVar160._13_3_ = auVar161._13_3_;
  auVar160._0_12_ = auVar119._0_12_;
  auVar160[0xc] = auVar119[6];
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_11_ = auVar119._0_11_;
  auVar159[0xb] = auVar119[5];
  auVar158._11_5_ = auVar159._11_5_;
  auVar158._0_10_ = auVar119._0_10_;
  auVar158[10] = auVar119[5];
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_9_ = auVar119._0_9_;
  auVar157[9] = auVar119[4];
  auVar156._9_7_ = auVar157._9_7_;
  auVar156._0_8_ = auVar119._0_8_;
  auVar156[8] = auVar119[4];
  auVar155._8_8_ = auVar156._8_8_;
  auVar155[7] = auVar119[3];
  auVar155[6] = auVar119[3];
  auVar155[5] = auVar119[2];
  auVar155[4] = auVar119[2];
  auVar155[3] = auVar119[1];
  auVar155[2] = auVar119[1];
  auVar155[0] = auVar119[0];
  auVar155[1] = auVar155[0];
  auVar119 = psraw(auVar155,0xb);
  auVar287 = psraw(auVar167,0xb);
  auVar119 = packsswb(auVar119,auVar287);
  auVar168[0] = auVar119[0] + '\x01';
  cVar171 = auVar119[1] + '\x01';
  cVar173 = auVar119[2] + '\x01';
  cVar176 = auVar119[3] + '\x01';
  cVar178 = auVar119[4] + '\x01';
  cVar181 = auVar119[5] + '\x01';
  cVar183 = auVar119[6] + '\x01';
  cVar186 = auVar119[7] + '\x01';
  auVar168._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar186,cVar186),cVar183),
                                                     cVar183),cVar181),cVar181),cVar178),
                 CONCAT11(cVar178,cVar186)) >> 8);
  auVar168[7] = cVar176;
  auVar168[6] = cVar176;
  auVar168[5] = cVar173;
  auVar168[4] = cVar173;
  auVar168[3] = cVar171;
  auVar168[2] = cVar171;
  auVar168[1] = auVar168[0];
  auVar287 = psraw(auVar168,9);
  auVar287 = packsswb(auVar287,auVar287);
  auVar220._8_8_ = SUB168(auVar287 & auVar145,8);
  auVar220._0_8_ = auVar119._8_8_;
  auVar163._0_8_ = auVar119._0_8_;
  auVar163._8_8_ = SUB168(auVar287 & auVar145,0);
  auVar119 = psubsb(auVar200 ^ _DAT_004d2980,auVar163);
  auVar287 = paddsb(auVar220,auVar270 ^ _DAT_004d2980);
  auVar119 = auVar119 ^ _DAT_004d2980;
  auVar287 = auVar287 ^ _DAT_004d2980;
  auVar200 = psubusb(auVar208,auVar105);
  auVar200 = auVar200 | auVar268;
  auVar209 = auVar209 | auVar275;
  bVar221 = auVar200[0];
  bVar226 = auVar209[0];
  bVar226 = (bVar226 < bVar221) * bVar221 | (bVar226 >= bVar221) * bVar226;
  bVar221 = auVar200[1];
  bVar228 = auVar209[1];
  bVar228 = (bVar228 < bVar221) * bVar221 | (bVar228 >= bVar221) * bVar228;
  bVar221 = auVar200[2];
  bVar233 = auVar209[2];
  bVar233 = (bVar233 < bVar221) * bVar221 | (bVar233 >= bVar221) * bVar233;
  bVar221 = auVar200[3];
  bVar235 = auVar209[3];
  bVar235 = (bVar235 < bVar221) * bVar221 | (bVar235 >= bVar221) * bVar235;
  bVar221 = auVar200[4];
  bVar240 = auVar209[4];
  bVar240 = (bVar240 < bVar221) * bVar221 | (bVar240 >= bVar221) * bVar240;
  bVar221 = auVar200[5];
  bVar242 = auVar209[5];
  bVar242 = (bVar242 < bVar221) * bVar221 | (bVar242 >= bVar221) * bVar242;
  bVar221 = auVar200[6];
  bVar247 = auVar209[6];
  bVar247 = (bVar247 < bVar221) * bVar221 | (bVar247 >= bVar221) * bVar247;
  bVar221 = auVar200[7];
  bVar115 = auVar209[7];
  bVar115 = (bVar115 < bVar221) * bVar221 | (bVar115 >= bVar221) * bVar115;
  bVar221 = auVar200[8];
  bVar120 = auVar209[8];
  bVar120 = (bVar120 < bVar221) * bVar221 | (bVar120 >= bVar221) * bVar120;
  bVar221 = auVar200[9];
  bVar122 = auVar209[9];
  bVar122 = (bVar122 < bVar221) * bVar221 | (bVar122 >= bVar221) * bVar122;
  bVar221 = auVar200[10];
  bVar125 = auVar209[10];
  bVar125 = (bVar125 < bVar221) * bVar221 | (bVar125 >= bVar221) * bVar125;
  bVar221 = auVar200[0xb];
  bVar127 = auVar209[0xb];
  bVar127 = (bVar127 < bVar221) * bVar221 | (bVar127 >= bVar221) * bVar127;
  bVar221 = auVar200[0xc];
  bVar130 = auVar209[0xc];
  bVar130 = (bVar130 < bVar221) * bVar221 | (bVar130 >= bVar221) * bVar130;
  bVar221 = auVar200[0xd];
  bVar132 = auVar209[0xd];
  bVar132 = (bVar132 < bVar221) * bVar221 | (bVar132 >= bVar221) * bVar132;
  bVar221 = auVar200[0xe];
  bVar136 = auVar209[0xe];
  bVar249 = auVar209[0xf];
  bVar136 = (bVar136 < bVar221) * bVar221 | (bVar136 >= bVar221) * bVar136;
  bVar221 = auVar200[0xf];
  bVar249 = (bVar249 < bVar221) * bVar221 | (bVar249 >= bVar221) * bVar249;
  bVar207 = (bVar226 < bVar207) * bVar207 | (bVar226 >= bVar207) * bVar226;
  bVar211 = (bVar228 < bVar211) * bVar211 | (bVar228 >= bVar211) * bVar228;
  bVar212 = (bVar233 < bVar212) * bVar212 | (bVar233 >= bVar212) * bVar233;
  bVar213 = (bVar235 < bVar213) * bVar213 | (bVar235 >= bVar213) * bVar235;
  bVar214 = (bVar240 < bVar214) * bVar214 | (bVar240 >= bVar214) * bVar240;
  bVar215 = (bVar242 < bVar215) * bVar215 | (bVar242 >= bVar215) * bVar242;
  bVar216 = (bVar247 < bVar216) * bVar216 | (bVar247 >= bVar216) * bVar247;
  bVar217 = (bVar115 < bVar217) * bVar217 | (bVar115 >= bVar217) * bVar115;
  bVar221 = (bVar120 < bVar116) * bVar116 | (bVar120 >= bVar116) * bVar120;
  bVar242 = (bVar122 < bVar121) * bVar121 | (bVar122 >= bVar121) * bVar122;
  bVar240 = (bVar125 < bVar123) * bVar123 | (bVar125 >= bVar123) * bVar125;
  bVar235 = (bVar127 < bVar126) * bVar126 | (bVar127 >= bVar126) * bVar127;
  bVar247 = (bVar130 < bVar128) * bVar128 | (bVar130 >= bVar128) * bVar130;
  bVar233 = (bVar132 < bVar131) * bVar131 | (bVar132 >= bVar131) * bVar132;
  bVar228 = (bVar136 < bVar133) * bVar133 | (bVar136 >= bVar133) * bVar136;
  bVar226 = (bVar249 < bVar137) * bVar137 | (bVar249 >= bVar137) * bVar249;
  bVar207 = (bVar221 < bVar207) * bVar207 | (bVar221 >= bVar207) * bVar221;
  bVar211 = (bVar242 < bVar211) * bVar211 | (bVar242 >= bVar211) * bVar242;
  bVar212 = (bVar240 < bVar212) * bVar212 | (bVar240 >= bVar212) * bVar240;
  bVar213 = (bVar235 < bVar213) * bVar213 | (bVar235 >= bVar213) * bVar235;
  bVar214 = (bVar247 < bVar214) * bVar214 | (bVar247 >= bVar214) * bVar247;
  bVar215 = (bVar233 < bVar215) * bVar215 | (bVar233 >= bVar215) * bVar233;
  bVar216 = (bVar228 < bVar216) * bVar216 | (bVar228 >= bVar216) * bVar228;
  bVar217 = (bVar226 < bVar217) * bVar217 | (bVar226 >= bVar217) * bVar226;
  bVar221 = (bVar221 != 0) * bVar221;
  bVar242 = (bVar242 != 0) * bVar242;
  bVar240 = (bVar240 != 0) * bVar240;
  bVar235 = (bVar235 != 0) * bVar235;
  bVar247 = (bVar247 != 0) * bVar247;
  bVar233 = (bVar233 != 0) * bVar233;
  bVar228 = (bVar228 != 0) * bVar228;
  bVar226 = (bVar226 != 0) * bVar226;
  auVar275[0] = -((byte)((bVar207 == 0) * bVar207 | bVar207 != 0) == bVar207);
  auVar275[1] = -((byte)((bVar211 == 0) * bVar211 | bVar211 != 0) == bVar211);
  auVar275[2] = -((byte)((bVar212 == 0) * bVar212 | bVar212 != 0) == bVar212);
  auVar275[3] = -((byte)((bVar213 == 0) * bVar213 | bVar213 != 0) == bVar213);
  auVar275[4] = -((byte)((bVar214 == 0) * bVar214 | bVar214 != 0) == bVar214);
  auVar275[5] = -((byte)((bVar215 == 0) * bVar215 | bVar215 != 0) == bVar215);
  auVar275[6] = -((byte)((bVar216 == 0) * bVar216 | bVar216 != 0) == bVar216);
  auVar275[7] = -((byte)((bVar217 == 0) * bVar217 | bVar217 != 0) == bVar217);
  auVar275[8] = -((byte)((bVar221 == 0) * bVar221 | bVar221 != 0) == bVar221);
  auVar275[9] = -((byte)((bVar242 == 0) * bVar242 | bVar242 != 0) == bVar242);
  auVar275[10] = -((byte)((bVar240 == 0) * bVar240 | bVar240 != 0) == bVar240);
  auVar275[0xb] = -((byte)((bVar235 == 0) * bVar235 | bVar235 != 0) == bVar235);
  auVar275[0xc] = -((byte)((bVar247 == 0) * bVar247 | bVar247 != 0) == bVar247);
  auVar275[0xd] = -((byte)((bVar233 == 0) * bVar233 | bVar233 != 0) == bVar233);
  auVar275[0xe] = -((byte)((bVar228 == 0) * bVar228 | bVar228 != 0) == bVar228);
  auVar275[0xf] = -((byte)((bVar226 == 0) * bVar226 | bVar226 != 0) == bVar226);
  auVar275 = auVar275 & auVar144;
  auVar210._0_8_ = auVar275._0_8_;
  auVar210._8_4_ = auVar275._0_4_;
  auVar210._12_4_ = auVar275._4_4_;
  auVar268[0] = -(auVar275[0] == '\0');
  auVar268[1] = -(auVar275[1] == '\0');
  auVar268[2] = -(auVar275[2] == '\0');
  auVar268[3] = -(auVar275[3] == '\0');
  auVar268[4] = -(auVar275[4] == '\0');
  auVar268[5] = -(auVar275[5] == '\0');
  auVar268[6] = -(auVar275[6] == '\0');
  auVar268[7] = -(auVar275[7] == '\0');
  auVar268[8] = -(auVar275[0] == '\0');
  auVar268[9] = -(auVar275[1] == '\0');
  auVar268[10] = -(auVar275[2] == '\0');
  auVar268[0xb] = -(auVar275[3] == '\0');
  auVar268[0xc] = -(auVar275[4] == '\0');
  auVar268[0xd] = -(auVar275[5] == '\0');
  auVar268[0xe] = -(auVar275[6] == '\0');
  auVar268[0xf] = -(auVar275[7] == '\0');
  if ((ushort)((ushort)(SUB161(auVar268 >> 7,0) & 1) | (ushort)(SUB161(auVar268 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar268 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar268 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar268 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar268 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar268 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar268 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar268 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar268 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar268 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar268 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar268 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar268 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar268 >> 0x77,0) & 1) << 0xe | (ushort)(auVar268[0xf] >> 7) << 0xf
              ) != 0xffff) {
    uVar5 = *(ulong *)(s + -(long)(p * 4));
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar166;
    auVar7[0xe] = (char)(uVar166 >> 0x38);
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar166;
    auVar15[0xc] = (char)(uVar166 >> 0x30);
    auVar15._13_2_ = auVar7._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = uVar166;
    auVar23._12_3_ = auVar15._12_3_;
    auVar31._8_2_ = 0;
    auVar31._0_8_ = uVar166;
    auVar31[10] = (char)(uVar166 >> 0x28);
    auVar31._11_4_ = auVar23._11_4_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = uVar166;
    auVar39._10_5_ = auVar31._10_5_;
    auVar47[8] = (char)(uVar166 >> 0x20);
    auVar47._0_8_ = uVar166;
    auVar47._9_6_ = auVar39._9_6_;
    auVar65._7_8_ = 0;
    auVar65._0_7_ = auVar47._8_7_;
    Var66 = CONCAT81(SUB158(auVar65 << 0x40,7),(char)(uVar166 >> 0x18));
    auVar88._9_6_ = 0;
    auVar88._0_9_ = Var66;
    auVar67._1_10_ = SUB1510(auVar88 << 0x30,5);
    auVar67[0] = (char)(uVar166 >> 0x10);
    auVar89._11_4_ = 0;
    auVar89._0_11_ = auVar67;
    auVar56[2] = (char)(uVar166 >> 8);
    auVar56._0_2_ = (ushort)uVar166;
    auVar56._3_12_ = SUB1512(auVar89 << 0x20,3);
    uVar271 = (ushort)uVar166 & 0xff;
    auVar8._8_6_ = 0;
    auVar8._0_8_ = uVar1;
    auVar8[0xe] = (char)(uVar1 >> 0x38);
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[0xc] = (char)(uVar1 >> 0x30);
    auVar16._13_2_ = auVar8._13_2_;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24._12_3_ = auVar16._12_3_;
    auVar32._8_2_ = 0;
    auVar32._0_8_ = uVar1;
    auVar32[10] = (char)(uVar1 >> 0x28);
    auVar32._11_4_ = auVar24._11_4_;
    auVar40._8_2_ = 0;
    auVar40._0_8_ = uVar1;
    auVar40._10_5_ = auVar32._10_5_;
    auVar48[8] = (char)(uVar1 >> 0x20);
    auVar48._0_8_ = uVar1;
    auVar48._9_6_ = auVar40._9_6_;
    auVar68._7_8_ = 0;
    auVar68._0_7_ = auVar48._8_7_;
    Var69 = CONCAT81(SUB158(auVar68 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar90._9_6_ = 0;
    auVar90._0_9_ = Var69;
    auVar70._1_10_ = SUB1510(auVar90 << 0x30,5);
    auVar70[0] = (char)(uVar1 >> 0x10);
    auVar91._11_4_ = 0;
    auVar91._0_11_ = auVar70;
    auVar57[2] = (char)(uVar1 >> 8);
    auVar57._0_2_ = (ushort)uVar1;
    auVar57._3_12_ = SUB1512(auVar91 << 0x20,3);
    uVar199 = (ushort)uVar1 & 0xff;
    auVar9._8_6_ = 0;
    auVar9._0_8_ = uVar2;
    auVar9[0xe] = (char)(uVar2 >> 0x38);
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar2;
    auVar17[0xc] = (char)(uVar2 >> 0x30);
    auVar17._13_2_ = auVar9._13_2_;
    auVar25._8_4_ = 0;
    auVar25._0_8_ = uVar2;
    auVar25._12_3_ = auVar17._12_3_;
    auVar33._8_2_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33[10] = (char)(uVar2 >> 0x28);
    auVar33._11_4_ = auVar25._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = uVar2;
    auVar41._10_5_ = auVar33._10_5_;
    auVar49[8] = (char)(uVar2 >> 0x20);
    auVar49._0_8_ = uVar2;
    auVar49._9_6_ = auVar41._9_6_;
    auVar71._7_8_ = 0;
    auVar71._0_7_ = auVar49._8_7_;
    Var72 = CONCAT81(SUB158(auVar71 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar92._9_6_ = 0;
    auVar92._0_9_ = Var72;
    auVar73._1_10_ = SUB1510(auVar92 << 0x30,5);
    auVar73[0] = (char)(uVar2 >> 0x10);
    auVar93._11_4_ = 0;
    auVar93._0_11_ = auVar73;
    auVar58[2] = (char)(uVar2 >> 8);
    auVar58._0_2_ = (ushort)uVar2;
    auVar58._3_12_ = SUB1512(auVar93 << 0x20,3);
    uVar274 = (ushort)uVar2 & 0xff;
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar6;
    auVar10[0xe] = (char)(uVar6 >> 0x38);
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar6;
    auVar18[0xc] = (char)(uVar6 >> 0x30);
    auVar18._13_2_ = auVar10._13_2_;
    auVar26._8_4_ = 0;
    auVar26._0_8_ = uVar6;
    auVar26._12_3_ = auVar18._12_3_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar6;
    auVar34[10] = (char)(uVar6 >> 0x28);
    auVar34._11_4_ = auVar26._11_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = uVar6;
    auVar42._10_5_ = auVar34._10_5_;
    auVar50[8] = (char)(uVar6 >> 0x20);
    auVar50._0_8_ = uVar6;
    auVar50._9_6_ = auVar42._9_6_;
    auVar74._7_8_ = 0;
    auVar74._0_7_ = auVar50._8_7_;
    Var75 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)(uVar6 >> 0x18));
    auVar94._9_6_ = 0;
    auVar94._0_9_ = Var75;
    auVar76._1_10_ = SUB1510(auVar94 << 0x30,5);
    auVar76[0] = (char)(uVar6 >> 0x10);
    auVar95._11_4_ = 0;
    auVar95._0_11_ = auVar76;
    auVar59[2] = (char)(uVar6 >> 8);
    auVar59._0_2_ = (ushort)uVar6;
    auVar59._3_12_ = SUB1512(auVar95 << 0x20,3);
    uVar109 = (ushort)uVar6 & 0xff;
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar3;
    auVar11[0xe] = (char)(uVar3 >> 0x38);
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar3;
    auVar19[0xc] = (char)(uVar3 >> 0x30);
    auVar19._13_2_ = auVar11._13_2_;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar3;
    auVar27._12_3_ = auVar19._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar3;
    auVar35[10] = (char)(uVar3 >> 0x28);
    auVar35._11_4_ = auVar27._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = uVar3;
    auVar43._10_5_ = auVar35._10_5_;
    auVar51[8] = (char)(uVar3 >> 0x20);
    auVar51._0_8_ = uVar3;
    auVar51._9_6_ = auVar43._9_6_;
    auVar77._7_8_ = 0;
    auVar77._0_7_ = auVar51._8_7_;
    Var78 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar96._9_6_ = 0;
    auVar96._0_9_ = Var78;
    auVar79._1_10_ = SUB1510(auVar96 << 0x30,5);
    auVar79[0] = (char)(uVar3 >> 0x10);
    auVar97._11_4_ = 0;
    auVar97._0_11_ = auVar79;
    auVar60[2] = (char)(uVar3 >> 8);
    auVar60._0_2_ = (ushort)uVar3;
    auVar60._3_12_ = SUB1512(auVar97 << 0x20,3);
    uVar272 = (ushort)uVar3 & 0xff;
    auVar12._8_6_ = 0;
    auVar12._0_8_ = uVar118;
    auVar12[0xe] = (char)(uVar118 >> 0x38);
    auVar20._8_4_ = 0;
    auVar20._0_8_ = uVar118;
    auVar20[0xc] = (char)(uVar118 >> 0x30);
    auVar20._13_2_ = auVar12._13_2_;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = uVar118;
    auVar28._12_3_ = auVar20._12_3_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = uVar118;
    auVar36[10] = (char)(uVar118 >> 0x28);
    auVar36._11_4_ = auVar28._11_4_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = uVar118;
    auVar44._10_5_ = auVar36._10_5_;
    auVar52[8] = (char)(uVar118 >> 0x20);
    auVar52._0_8_ = uVar118;
    auVar52._9_6_ = auVar44._9_6_;
    auVar80._7_8_ = 0;
    auVar80._0_7_ = auVar52._8_7_;
    Var81 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)(uVar118 >> 0x18));
    auVar98._9_6_ = 0;
    auVar98._0_9_ = Var81;
    auVar82._1_10_ = SUB1510(auVar98 << 0x30,5);
    auVar82[0] = (char)(uVar118 >> 0x10);
    auVar99._11_4_ = 0;
    auVar99._0_11_ = auVar82;
    auVar61[2] = (char)(uVar118 >> 8);
    auVar61._0_2_ = (ushort)uVar118;
    auVar61._3_12_ = SUB1512(auVar99 << 0x20,3);
    uVar153 = (ushort)uVar118 & 0xff;
    auVar13._8_6_ = 0;
    auVar13._0_8_ = uVar5;
    auVar13[0xe] = (char)(uVar5 >> 0x38);
    auVar21._8_4_ = 0;
    auVar21._0_8_ = uVar5;
    auVar21[0xc] = (char)(uVar5 >> 0x30);
    auVar21._13_2_ = auVar13._13_2_;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = uVar5;
    auVar29._12_3_ = auVar21._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = uVar5;
    auVar37[10] = (char)(uVar5 >> 0x28);
    auVar37._11_4_ = auVar29._11_4_;
    auVar45._8_2_ = 0;
    auVar45._0_8_ = uVar5;
    auVar45._10_5_ = auVar37._10_5_;
    auVar53[8] = (char)(uVar5 >> 0x20);
    auVar53._0_8_ = uVar5;
    auVar53._9_6_ = auVar45._9_6_;
    auVar83._7_8_ = 0;
    auVar83._0_7_ = auVar53._8_7_;
    Var84 = CONCAT81(SUB158(auVar83 << 0x40,7),(char)(uVar5 >> 0x18));
    auVar100._9_6_ = 0;
    auVar100._0_9_ = Var84;
    auVar85._1_10_ = SUB1510(auVar100 << 0x30,5);
    auVar85[0] = (char)(uVar5 >> 0x10);
    auVar101._11_4_ = 0;
    auVar101._0_11_ = auVar85;
    auVar62[2] = (char)(uVar5 >> 8);
    auVar62._0_2_ = (ushort)uVar5;
    auVar62._3_12_ = SUB1512(auVar101 << 0x20,3);
    uVar108 = (ushort)uVar5 & 0xff;
    sVar225 = auVar62._2_2_;
    sVar232 = auVar85._0_2_;
    sVar239 = (short)Var84;
    sVar246 = auVar53._8_2_;
    sVar252 = auVar37._10_2_;
    sVar257 = auVar21._12_2_;
    uVar106 = auVar13._13_2_ >> 8;
    sVar201 = auVar57._2_2_;
    sVar230 = auVar56._2_2_;
    sVar202 = auVar70._0_2_;
    sVar237 = auVar67._0_2_;
    sVar203 = (short)Var69;
    sVar244 = (short)Var66;
    sVar204 = auVar48._8_2_;
    sVar250 = auVar47._8_2_;
    sVar205 = auVar32._10_2_;
    sVar255 = auVar31._10_2_;
    sVar206 = auVar16._12_2_;
    sVar260 = auVar15._12_2_;
    uVar269 = auVar7._13_2_ >> 8;
    uVar142 = auVar8._13_2_ >> 8;
    sVar279 = (short)Var72;
    uVar284 = auVar9._13_2_ >> 8;
    sVar223 = uVar271 + uVar199 + uVar108 * 2 + uVar274 + 4;
    sVar231 = sVar230 + sVar201 + sVar225 * 2 + auVar58._2_2_ + 4;
    sVar238 = sVar237 + sVar202 + sVar232 * 2 + auVar73._0_2_ + 4;
    sVar245 = sVar244 + sVar203 + sVar239 * 2 + sVar279 + 4;
    sVar251 = sVar250 + sVar204 + sVar246 * 2 + auVar49._8_2_ + 4;
    sVar256 = sVar255 + sVar205 + sVar252 * 2 + auVar33._10_2_ + 4;
    sVar261 = sVar260 + sVar206 + sVar257 * 2 + auVar17._12_2_ + 4;
    sVar265 = uVar269 + uVar142 + uVar106 * 2 + uVar284 + 4;
    auVar14._8_6_ = 0;
    auVar14._0_8_ = uVar4;
    auVar14[0xe] = (char)(uVar4 >> 0x38);
    auVar22._8_4_ = 0;
    auVar22._0_8_ = uVar4;
    auVar22[0xc] = (char)(uVar4 >> 0x30);
    auVar22._13_2_ = auVar14._13_2_;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = uVar4;
    auVar30._12_3_ = auVar22._12_3_;
    auVar38._8_2_ = 0;
    auVar38._0_8_ = uVar4;
    auVar38[10] = (char)(uVar4 >> 0x28);
    auVar38._11_4_ = auVar30._11_4_;
    auVar46._8_2_ = 0;
    auVar46._0_8_ = uVar4;
    auVar46._10_5_ = auVar38._10_5_;
    auVar54[8] = (char)(uVar4 >> 0x20);
    auVar54._0_8_ = uVar4;
    auVar54._9_6_ = auVar46._9_6_;
    auVar86._7_8_ = 0;
    auVar86._0_7_ = auVar54._8_7_;
    Var66 = CONCAT81(SUB158(auVar86 << 0x40,7),(char)(uVar4 >> 0x18));
    auVar102._9_6_ = 0;
    auVar102._0_9_ = Var66;
    auVar87._1_10_ = SUB1510(auVar102 << 0x30,5);
    auVar87[0] = (char)(uVar4 >> 0x10);
    auVar103._11_4_ = 0;
    auVar103._0_11_ = auVar87;
    auVar63[2] = (char)(uVar4 >> 8);
    auVar63._0_2_ = (ushort)uVar4;
    auVar63._3_12_ = SUB1512(auVar103 << 0x20,3);
    uVar285 = (ushort)uVar4 & 0xff;
    sVar262 = auVar59._2_2_;
    sVar266 = auVar76._0_2_;
    sVar110 = (short)Var75;
    sVar111 = auVar50._8_2_;
    sVar112 = auVar34._10_2_;
    sVar113 = auVar18._12_2_;
    uVar114 = auVar10._13_2_ >> 8;
    uVar165 = (ushort)(uVar271 + uVar108 + uVar109 + sVar223) >> 3;
    uVar174 = (ushort)(sVar230 + sVar225 + sVar262 + sVar231) >> 3;
    uVar179 = (ushort)(sVar237 + sVar232 + sVar266 + sVar238) >> 3;
    uVar184 = (ushort)(sVar244 + sVar239 + sVar110 + sVar245) >> 3;
    uVar188 = (ushort)(sVar250 + sVar246 + sVar111 + sVar251) >> 3;
    uVar191 = (ushort)(sVar255 + sVar252 + sVar112 + sVar256) >> 3;
    uVar194 = (ushort)(sVar260 + sVar257 + sVar113 + sVar261) >> 3;
    uVar197 = (ushort)(uVar269 + uVar106 + uVar114 + sVar265) >> 3;
    sVar117 = uVar272 + uVar109;
    sVar124 = auVar60._2_2_ + sVar262;
    sVar129 = auVar79._0_2_ + sVar266;
    sVar135 = (short)Var78;
    sVar134 = sVar135 + sVar110;
    sVar138 = auVar51._8_2_ + sVar111;
    sVar139 = auVar35._10_2_ + sVar112;
    uVar273 = auVar11._13_2_ >> 8;
    sVar140 = auVar19._12_2_ + sVar113;
    sVar141 = uVar273 + uVar114;
    uVar143 = (ushort)(sVar117 + uVar199 + sVar223) >> 3;
    uVar146 = (ushort)(sVar124 + sVar201 + sVar231) >> 3;
    uVar147 = (ushort)(sVar129 + sVar202 + sVar238) >> 3;
    uVar148 = (ushort)(sVar134 + sVar203 + sVar245) >> 3;
    uVar149 = (ushort)(sVar138 + sVar204 + sVar251) >> 3;
    uVar150 = (ushort)(sVar139 + sVar205 + sVar256) >> 3;
    uVar151 = (ushort)(sVar140 + sVar206 + sVar261) >> 3;
    uVar152 = (ushort)(sVar141 + uVar142 + sVar265) >> 3;
    sVar224 = (sVar223 - uVar108) + uVar153;
    sVar231 = (sVar231 - sVar225) + auVar61._2_2_;
    sVar238 = (sVar238 - sVar232) + auVar82._0_2_;
    sVar223 = (short)Var81;
    sVar245 = (sVar245 - sVar239) + sVar223;
    sVar251 = (sVar251 - sVar246) + auVar52._8_2_;
    sVar256 = (sVar256 - sVar252) + auVar36._10_2_;
    sVar261 = (sVar261 - sVar257) + auVar20._12_2_;
    uVar55 = auVar12._13_2_ >> 8;
    sVar265 = (sVar265 - uVar106) + uVar55;
    uVar274 = (ushort)(uVar274 + sVar117 + sVar224) >> 3;
    uVar277 = (ushort)(auVar58._2_2_ + sVar124 + sVar231) >> 3;
    uVar278 = (ushort)(auVar73._0_2_ + sVar129 + sVar238) >> 3;
    uVar280 = (ushort)(sVar279 + sVar134 + sVar245) >> 3;
    uVar281 = (ushort)(auVar49._8_2_ + sVar138 + sVar251) >> 3;
    uVar282 = (ushort)(auVar33._10_2_ + sVar139 + sVar256) >> 3;
    uVar283 = (ushort)(auVar17._12_2_ + sVar140 + sVar261) >> 3;
    uVar284 = (ushort)(uVar284 + sVar141 + sVar265) >> 3;
    auVar276[1] = (uVar277 != 0) * (uVar277 < 0x100) * (char)uVar277 - (0xff < uVar277);
    auVar276[0] = (uVar274 != 0) * (uVar274 < 0x100) * (char)uVar274 - (0xff < uVar274);
    auVar276[2] = (uVar278 != 0) * (uVar278 < 0x100) * (char)uVar278 - (0xff < uVar278);
    auVar276[3] = (uVar280 != 0) * (uVar280 < 0x100) * (char)uVar280 - (0xff < uVar280);
    auVar276[4] = (uVar281 != 0) * (uVar281 < 0x100) * (char)uVar281 - (0xff < uVar281);
    auVar276[5] = (uVar282 != 0) * (uVar282 < 0x100) * (char)uVar282 - (0xff < uVar282);
    auVar276[6] = (uVar283 != 0) * (uVar283 < 0x100) * (char)uVar283 - (0xff < uVar283);
    auVar276[7] = (uVar284 != 0) * (uVar284 < 0x100) * (char)uVar284 - (0xff < uVar284);
    auVar276[8] = (uVar143 != 0) * (uVar143 < 0x100) * (char)uVar143 - (0xff < uVar143);
    auVar276[9] = (uVar146 != 0) * (uVar146 < 0x100) * (char)uVar146 - (0xff < uVar146);
    auVar276[10] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
    auVar276[0xb] = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
    auVar276[0xc] = (uVar149 != 0) * (uVar149 < 0x100) * (char)uVar149 - (0xff < uVar149);
    auVar276[0xd] = (uVar150 != 0) * (uVar150 < 0x100) * (char)uVar150 - (0xff < uVar150);
    auVar276[0xe] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
    auVar276[0xf] = (uVar152 != 0) * (uVar152 < 0x100) * (char)uVar152 - (0xff < uVar152);
    sVar224 = (sVar224 - uVar108) + uVar285;
    sVar279 = auVar63._2_2_;
    sVar231 = (sVar231 - sVar225) + sVar279;
    sVar288 = auVar87._0_2_;
    sVar238 = (sVar238 - sVar232) + sVar288;
    sVar289 = (short)Var66;
    sVar245 = (sVar245 - sVar239) + sVar289;
    sVar290 = auVar54._8_2_;
    sVar251 = (sVar251 - sVar246) + sVar290;
    sVar291 = auVar38._10_2_;
    sVar256 = (sVar256 - sVar252) + sVar291;
    sVar292 = auVar22._12_2_;
    sVar261 = (sVar261 - sVar257) + sVar292;
    uVar284 = auVar14._13_2_ >> 8;
    sVar265 = (sVar265 - uVar106) + uVar284;
    uVar106 = (ushort)(uVar109 + sVar117 + sVar224) >> 3;
    uVar108 = (ushort)(sVar262 + sVar124 + sVar231) >> 3;
    uVar109 = (ushort)(sVar266 + sVar129 + sVar238) >> 3;
    uVar143 = (ushort)(sVar110 + sVar134 + sVar245) >> 3;
    uVar146 = (ushort)(sVar111 + sVar138 + sVar251) >> 3;
    uVar147 = (ushort)(sVar112 + sVar139 + sVar256) >> 3;
    uVar148 = (ushort)(sVar113 + sVar140 + sVar261) >> 3;
    uVar114 = (ushort)(uVar114 + sVar141 + sVar265) >> 3;
    sVar225 = (sVar224 - uVar271) + uVar285;
    sVar232 = (sVar231 - sVar230) + sVar279;
    sVar239 = (sVar238 - sVar237) + sVar288;
    sVar246 = (sVar245 - sVar244) + sVar289;
    sVar252 = (sVar251 - sVar250) + sVar290;
    sVar257 = (sVar256 - sVar255) + sVar291;
    sVar262 = (sVar261 - sVar260) + sVar292;
    sVar266 = (sVar265 - uVar269) + uVar284;
    uVar269 = (ushort)(uVar272 + sVar117 + sVar225) >> 3;
    uVar149 = (ushort)(auVar60._2_2_ + sVar124 + sVar232) >> 3;
    uVar150 = (ushort)(auVar79._0_2_ + sVar129 + sVar239) >> 3;
    uVar151 = (ushort)(sVar135 + sVar134 + sVar246) >> 3;
    uVar152 = (ushort)(auVar51._8_2_ + sVar138 + sVar252) >> 3;
    uVar271 = (ushort)(auVar35._10_2_ + sVar139 + sVar257) >> 3;
    uVar272 = (ushort)(auVar19._12_2_ + sVar140 + sVar262) >> 3;
    uVar273 = (ushort)(uVar273 + sVar141 + sVar266) >> 3;
    auVar107[1] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
    auVar107[0] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    auVar107[2] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    auVar107[3] = (uVar143 != 0) * (uVar143 < 0x100) * (char)uVar143 - (0xff < uVar143);
    auVar107[4] = (uVar146 != 0) * (uVar146 < 0x100) * (char)uVar146 - (0xff < uVar146);
    auVar107[5] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
    auVar107[6] = (uVar148 != 0) * (uVar148 < 0x100) * (char)uVar148 - (0xff < uVar148);
    auVar107[7] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
    auVar107[8] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
    auVar107[9] = (uVar149 != 0) * (uVar149 < 0x100) * (char)uVar149 - (0xff < uVar149);
    auVar107[10] = (uVar150 != 0) * (uVar150 < 0x100) * (char)uVar150 - (0xff < uVar150);
    auVar107[0xb] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
    auVar107[0xc] = (uVar152 != 0) * (uVar152 < 0x100) * (char)uVar152 - (0xff < uVar152);
    auVar107[0xd] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
    auVar107[0xe] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
    auVar107[0xf] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
    uVar106 = (ushort)(sVar117 + uVar285 + (uVar153 - uVar199) + sVar225) >> 3;
    uVar269 = (ushort)(sVar124 + sVar279 + (auVar61._2_2_ - sVar201) + sVar232) >> 3;
    uVar114 = (ushort)(sVar129 + sVar288 + (auVar82._0_2_ - sVar202) + sVar239) >> 3;
    uVar273 = (ushort)(sVar134 + sVar289 + (sVar223 - sVar203) + sVar246) >> 3;
    uVar108 = (ushort)(sVar138 + sVar290 + (auVar52._8_2_ - sVar204) + sVar252) >> 3;
    uVar109 = (ushort)(sVar139 + sVar291 + (auVar36._10_2_ - sVar205) + sVar257) >> 3;
    uVar143 = (ushort)(sVar140 + sVar292 + (auVar20._12_2_ - sVar206) + sVar262) >> 3;
    uVar142 = (ushort)(sVar141 + uVar284 + (uVar55 - uVar142) + sVar266) >> 3;
    auVar169[1] = (uVar174 != 0) * (uVar174 < 0x100) * (char)uVar174 - (0xff < uVar174);
    auVar169[0] = (uVar165 != 0) * (uVar165 < 0x100) * (char)uVar165 - (0xff < uVar165);
    auVar169[2] = (uVar179 != 0) * (uVar179 < 0x100) * (char)uVar179 - (0xff < uVar179);
    auVar169[3] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
    auVar169[4] = (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188);
    auVar169[5] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
    auVar169[6] = (uVar194 != 0) * (uVar194 < 0x100) * (char)uVar194 - (0xff < uVar194);
    auVar169[7] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
    auVar169[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    auVar169[9] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
    auVar169[10] = (uVar114 != 0) * (uVar114 < 0x100) * (char)uVar114 - (0xff < uVar114);
    auVar169[0xb] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
    auVar169[0xc] = (uVar108 != 0) * (uVar108 < 0x100) * (char)uVar108 - (0xff < uVar108);
    auVar169[0xd] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    auVar169[0xe] = (uVar143 != 0) * (uVar143 < 0x100) * (char)uVar143 - (0xff < uVar143);
    auVar169[0xf] = (uVar142 != 0) * (uVar142 < 0x100) * (char)uVar142 - (0xff < uVar142);
    auVar144 = auVar169 & auVar210 | ~auVar210 & auVar105;
    uVar166 = auVar144._0_8_;
    uVar118 = auVar144._8_8_;
    auVar119 = auVar107 & auVar210 | ~auVar210 & auVar119;
    auVar287 = auVar276 & auVar210 | ~auVar210 & auVar287;
  }
  *(long *)(s + -lVar104) = auVar287._0_8_;
  *(long *)(s + lVar104 * -2) = auVar287._8_8_;
  *(long *)s = auVar119._0_8_;
  *(long *)(s + lVar104) = auVar119._8_8_;
  *(ulong *)(s + lVar104 * -3) = uVar166;
  *(ulong *)(s + lVar104 * 2) = uVar118;
  return;
}

Assistant:

void aom_lpf_horizontal_8_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                    const uint8_t *_limit0,
                                    const uint8_t *_thresh0,
                                    const uint8_t *_blimit1,
                                    const uint8_t *_limit1,
                                    const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i p2, p1, p0, q0, q1, q2, p3, q3;
  __m128i q1q0, p1p0;

  p3 = _mm_loadl_epi64((__m128i *)(s - 4 * p));
  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));
  q3 = _mm_loadl_epi64((__m128i *)(s + 3 * p));

  lpf_internal_8_dual_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0,
                           &blimit, &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
  _mm_storel_epi64((__m128i *)(s - 3 * p), p2);
  _mm_storel_epi64((__m128i *)(s + 2 * p), q2);
}